

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O1

void dlep_writer_start_signal(dlep_writer *writer,uint16_t signal_type)

{
  undefined2 local_c;
  ushort local_a;
  
  writer->signal_type = signal_type;
  writer->signal_start = writer->out->_len;
  local_a = signal_type << 8 | signal_type >> 8;
  abuf_memcpy(writer->out,&local_a,2);
  local_c = 0;
  abuf_memcpy(writer->out,&local_c,2);
  return;
}

Assistant:

void
dlep_writer_start_signal(struct dlep_writer *writer, uint16_t signal_type) {
  writer->signal_type = signal_type;
  writer->signal_start = abuf_getlen(writer->out);

  abuf_append_uint16(writer->out, htons(signal_type));
  abuf_append_uint16(writer->out, 0);
}